

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCommandLineArguments.cxx
# Opt level: O3

int argument(char *arg,char *value,void *call_data)

{
  size_t sVar1;
  char *__s;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Got argument: \"",0xf);
  if (arg == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x14a438);
  }
  else {
    sVar1 = strlen(arg);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,arg,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" value: \"",10);
  __s = "(null)";
  if (value != (char *)0x0) {
    __s = value;
  }
  sVar1 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\"",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  if (call_data != (void *)0x123) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem processing call_data",0x1c);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x10);
    std::ostream::put(-0x10);
    std::ostream::flush();
  }
  return (uint)(call_data == (void *)0x123);
}

Assistant:

static int argument(const char* arg, const char* value, void* call_data)
{
  std::cout << "Got argument: \"" << arg << "\" value: \"" << (value?value:"(null)") << "\"" << std::endl;
  if ( call_data != random_ptr )
    {
    std::cerr << "Problem processing call_data" << std::endl;
    return 0;
    }
  return 1;
}